

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int parse_numeric_servname(char *servname)

{
  uint uVar1;
  long lVar2;
  char *endptr;
  char *local_10;
  
  local_10 = (char *)0x0;
  lVar2 = strtol(servname,&local_10,10);
  uVar1 = (uint)lVar2;
  if (((0xffff < uVar1) || (local_10 == (char *)0x0 || *servname == '\0')) || (*local_10 != '\0')) {
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

static int
parse_numeric_servname(const char *servname)
{
	int n;
	char *endptr=NULL;
	n = (int) strtol(servname, &endptr, 10);
	if (n>=0 && n <= 65535 && servname[0] && endptr && !endptr[0])
		return n;
	else
		return -1;
}